

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fProgramInterfaceQueryTests.cpp
# Opt level: O1

void deqp::gles31::Functional::anon_unknown_0::generateBufferVariableMatrixVariableCases
               (Context *context,SharedPtr *parentStructure,TestCaseGroup *targetGroup,
               ProgramResourcePropFlags targetProp)

{
  Context *context_00;
  Node *pNVar1;
  SharedPtrStateBase *pSVar2;
  Node *pNVar3;
  ResourceTestCase *this;
  deInt32 *pdVar4;
  SharedPtr variable;
  SharedPtr unsized;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_58;
  TestNode *local_48;
  Context *local_40;
  ProgramResourceQueryTestTarget local_38;
  
  unsized.m_ptr = (Node *)&local_58;
  std::__cxx11::string::_M_construct<char_const*>((string *)&unsized,0x98644f);
  generateBufferBackedVariableAggregateTypeCases
            (context,parentStructure,targetGroup,PROGRAMINTERFACE_BUFFER_VARIABLE,targetProp,
             TYPE_FLOAT_MAT3X2,(string *)&unsized,2);
  local_40 = context;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)unsized.m_ptr != &local_58) {
    operator_delete(unsized.m_ptr,local_58._M_allocated_capacity + 1);
  }
  pNVar1 = (Node *)operator_new(0x28);
  pNVar1->_vptr_Node = (_func_int **)&PTR__Node_00b52778;
  pNVar1->m_type = TYPE_ARRAY_ELEMENT;
  (pNVar1->m_enclosingNode).m_ptr = parentStructure->m_ptr;
  pSVar2 = parentStructure->m_state;
  (pNVar1->m_enclosingNode).m_state = pSVar2;
  if (pSVar2 != (SharedPtrStateBase *)0x0) {
    LOCK();
    pSVar2->strongRefCount = pSVar2->strongRefCount + 1;
    UNLOCK();
    LOCK();
    pdVar4 = &((pNVar1->m_enclosingNode).m_state)->weakRefCount;
    *pdVar4 = *pdVar4 + 1;
    UNLOCK();
  }
  pNVar1->_vptr_Node = (_func_int **)&PTR__Node_00b528b8;
  *(undefined4 *)&pNVar1[1]._vptr_Node = 0xfffffffe;
  unsized.m_state = (SharedPtrStateBase *)0x0;
  unsized.m_ptr = pNVar1;
  local_48 = &targetGroup->super_TestNode;
  pSVar2 = (SharedPtrStateBase *)operator_new(0x20);
  pSVar2->strongRefCount = 0;
  pSVar2->weakRefCount = 0;
  pSVar2->_vptr_SharedPtrStateBase = (_func_int **)&PTR__SharedPtrState_00b52798;
  pSVar2[1]._vptr_SharedPtrStateBase = (_func_int **)pNVar1;
  pSVar2->strongRefCount = 1;
  pSVar2->weakRefCount = 1;
  unsized.m_state = pSVar2;
  pNVar3 = (Node *)operator_new(0x28);
  pNVar3->_vptr_Node = (_func_int **)&PTR__Node_00b52778;
  pNVar3->m_type = TYPE_VARIABLE;
  (pNVar3->m_enclosingNode).m_ptr = pNVar1;
  (pNVar3->m_enclosingNode).m_state = pSVar2;
  LOCK();
  pSVar2->strongRefCount = pSVar2->strongRefCount + 1;
  UNLOCK();
  LOCK();
  pdVar4 = &((pNVar3->m_enclosingNode).m_state)->weakRefCount;
  *pdVar4 = *pdVar4 + 1;
  UNLOCK();
  pNVar3->_vptr_Node = (_func_int **)&PTR__Node_00b528f0;
  *(undefined4 *)&pNVar3[1]._vptr_Node = 8;
  variable.m_state = (SharedPtrStateBase *)0x0;
  variable.m_ptr = pNVar3;
  pSVar2 = (SharedPtrStateBase *)operator_new(0x20);
  pSVar2->strongRefCount = 0;
  pSVar2->weakRefCount = 0;
  pSVar2->_vptr_SharedPtrStateBase = (_func_int **)&PTR__SharedPtrState_00b52798;
  pSVar2[1]._vptr_SharedPtrStateBase = (_func_int **)pNVar3;
  pSVar2->strongRefCount = 1;
  pSVar2->weakRefCount = 1;
  variable.m_state = pSVar2;
  this = (ResourceTestCase *)operator_new(0xb0);
  context_00 = local_40;
  ProgramResourceQueryTestTarget::ProgramResourceQueryTestTarget
            (&local_38,PROGRAMINTERFACE_BUFFER_VARIABLE,targetProp);
  ResourceTestCase::ResourceTestCase(this,context_00,&variable,&local_38,"var_unsized_array");
  tcu::TestNode::addChild(local_48,(TestNode *)this);
  pdVar4 = &pSVar2->strongRefCount;
  LOCK();
  *pdVar4 = *pdVar4 + -1;
  UNLOCK();
  if (*pdVar4 == 0) {
    variable.m_ptr = (Node *)0x0;
    (*(variable.m_state)->_vptr_SharedPtrStateBase[2])();
  }
  LOCK();
  pdVar4 = &(variable.m_state)->weakRefCount;
  *pdVar4 = *pdVar4 + -1;
  UNLOCK();
  if (*pdVar4 == 0) {
    if (variable.m_state != (SharedPtrStateBase *)0x0) {
      (*(variable.m_state)->_vptr_SharedPtrStateBase[1])();
    }
    variable.m_state = (SharedPtrStateBase *)0x0;
  }
  if (unsized.m_state != (SharedPtrStateBase *)0x0) {
    LOCK();
    pdVar4 = &(unsized.m_state)->strongRefCount;
    *pdVar4 = *pdVar4 + -1;
    UNLOCK();
    if (*pdVar4 == 0) {
      unsized.m_ptr = (Node *)0x0;
      (*(unsized.m_state)->_vptr_SharedPtrStateBase[2])();
    }
    LOCK();
    pdVar4 = &(unsized.m_state)->weakRefCount;
    *pdVar4 = *pdVar4 + -1;
    UNLOCK();
    if ((*pdVar4 == 0) && (unsized.m_state != (SharedPtrStateBase *)0x0)) {
      (*(unsized.m_state)->_vptr_SharedPtrStateBase[1])();
    }
  }
  return;
}

Assistant:

static void generateBufferVariableMatrixVariableCases (Context& context, const ResourceDefinition::Node::SharedPtr& parentStructure, tcu::TestCaseGroup* targetGroup, ProgramResourcePropFlags targetProp)
{
	// Basic aggregates
	generateBufferBackedVariableAggregateTypeCases(context, parentStructure, targetGroup, PROGRAMINTERFACE_BUFFER_VARIABLE, targetProp, glu::TYPE_FLOAT_MAT3X2, "", 2);

	// Unsized array
	{
		const ResourceDefinition::Node::SharedPtr	unsized		(new ResourceDefinition::ArrayElement(parentStructure, ResourceDefinition::ArrayElement::UNSIZED_ARRAY));
		const ResourceDefinition::Node::SharedPtr	variable	(new ResourceDefinition::Variable(unsized, glu::TYPE_FLOAT_MAT3X2));

		targetGroup->addChild(new ResourceTestCase(context, variable, ProgramResourceQueryTestTarget(PROGRAMINTERFACE_BUFFER_VARIABLE, targetProp), "var_unsized_array"));
	}
}